

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O2

void __thiscall FDecalLib::ParseSlider(FDecalLib *this,FScanner *sc)

{
  bool bVar1;
  FDecalSliderAnim *this_00;
  FString sliderName;
  int local_48;
  int local_44;
  double local_40;
  FDecalSliderAnim *local_38;
  
  sliderName.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FScanner::MustGetString(sc);
  FString::operator=(&sliderName,sc->String);
  FScanner::MustGetStringName(sc,"{");
  local_40 = 0.0;
  local_44 = 0;
  local_48 = 0;
  while( true ) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"}");
    if (bVar1) break;
    bVar1 = FScanner::Compare(sc,"SlideStart");
    if (bVar1) {
      FScanner::MustGetFloat(sc);
      local_44 = (int)(sc->Float * 35.0);
    }
    else {
      bVar1 = FScanner::Compare(sc,"SlideTime");
      if (bVar1) {
        FScanner::MustGetFloat(sc);
        local_48 = (int)(sc->Float * 35.0);
      }
      else {
        bVar1 = FScanner::Compare(sc,"DistX");
        if (bVar1) {
          FScanner::MustGetFloat(sc);
          Printf("DistX in slider decal %s is unsupported\n",sliderName.Chars);
        }
        else {
          bVar1 = FScanner::Compare(sc,"DistY");
          if (bVar1) {
            FScanner::MustGetFloat(sc);
            local_40 = sc->Float;
          }
          else {
            FScanner::ScriptError(sc,"Unknown slider parameter \'%s\'",sc->String);
          }
        }
      }
    }
  }
  if ((local_40 != 0.0) || (NAN(local_40))) {
    this_00 = (FDecalSliderAnim *)operator_new(0x20);
    FDecalSliderAnim::FDecalSliderAnim(this_00,sliderName.Chars);
    *(int *)&(this_00->super_FDecalAnimator).field_0xc = local_44;
    this_00->SlideTime = local_48;
    this_00->DistY = local_40;
    local_38 = this_00;
    TArray<FDecalAnimator_*,_FDecalAnimator_*>::Push
              (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>,
               (FDecalAnimator **)&local_38);
  }
  FString::~FString(&sliderName);
  return;
}

Assistant:

void FDecalLib::ParseSlider (FScanner &sc)
{
	FString sliderName;
	double distX = 0, distY = 0;
	int startTime = 0, takeTime = 0;

	sc.MustGetString ();
	sliderName = sc.String;
	sc.MustGetStringName ("{");
	
	for (;;)
	{
		sc.MustGetString ();
		if (sc.Compare ("}"))
		{
			if ((/*distX |*/ distY) != 0)
			{
				FDecalSliderAnim *slider = new FDecalSliderAnim (sliderName);
				slider->SlideStart = startTime;
				slider->SlideTime = takeTime;
				/*slider->DistX = distX;*/
				slider->DistY = distY;
				Animators.Push (slider);
			}
			break;
		}
		else if (sc.Compare ("SlideStart"))
		{
			sc.MustGetFloat ();
			startTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("SlideTime"))
		{
			sc.MustGetFloat ();
			takeTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("DistX"))
		{
			sc.MustGetFloat ();	// must remain to avoid breaking definitions that accidentally used DistX
			Printf ("DistX in slider decal %s is unsupported\n", sliderName.GetChars());
		}
		else if (sc.Compare ("DistY"))
		{
			sc.MustGetFloat ();
			distY = sc.Float;
		}
		else
		{
			sc.ScriptError ("Unknown slider parameter '%s'", sc.String);
		}
	}
}